

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* lest::split_option(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *__return_storage_ptr__,text *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  _Alloc_hider _Var6;
  size_type sVar7;
  undefined8 uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_type *psVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  undefined8 local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  undefined8 local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  
  lVar3 = std::__cxx11::string::rfind((char)arg,0x3d);
  if (lVar3 == -1) {
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    local_120._M_string_length = 0;
    local_120.field_2._M_allocated_capacity =
         local_120.field_2._M_allocated_capacity & 0xffffffffffffff00;
    std::make_pair<std::__cxx11::string&,std::__cxx11::string>(&local_60,arg,&local_120);
    sVar5 = local_60.first._M_string_length;
    paVar2 = &local_60.first.field_2;
    _Var4._M_p = local_60.first._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p == paVar2) {
      local_d0._8_8_ = local_60.first.field_2._8_8_;
      _Var4._M_p = (pointer)&local_d0;
    }
    local_d0._M_allocated_capacity = local_60.first.field_2._M_allocated_capacity;
    paVar9 = &local_60.second.field_2;
    local_60.first._M_string_length = 0;
    local_60.first.field_2._M_allocated_capacity =
         local_60.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
    _Var6._M_p = local_60.second._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.second._M_dataplus._M_p == paVar9) {
      local_b0._8_8_ = local_60.second.field_2._8_8_;
      _Var6._M_p = (pointer)&local_b0;
    }
    psVar10 = &local_60.second._M_string_length;
    sVar7 = local_60.second._M_string_length;
    local_60.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_a0,(ulong)arg);
    std::__cxx11::string::substr((ulong)&local_80,(ulong)arg);
    local_f8 = local_78;
    sVar5 = local_98;
    paVar2 = &local_60.first.field_2;
    _Var4._M_p = (pointer)local_a0;
    if (local_a0 == &local_90) {
      local_60.first.field_2._8_8_ = local_90._8_8_;
      _Var4._M_p = (pointer)paVar2;
    }
    local_60.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
    local_60.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
    local_98 = 0;
    local_90._M_local_buf[0] = '\0';
    paVar1 = &local_60.second.field_2;
    _Var6._M_p = (pointer)local_80;
    if (local_80 == &local_70) {
      local_60.second.field_2._8_8_ = local_70._8_8_;
      _Var6._M_p = (pointer)paVar1;
    }
    local_60.second.field_2._M_allocated_capacity._1_7_ = local_70._M_allocated_capacity._1_7_;
    local_60.second.field_2._M_local_buf[0] = local_70._M_local_buf[0];
    local_78 = 0;
    local_70._M_local_buf[0] = '\0';
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p == paVar2) {
      local_120.field_2._8_8_ = local_60.first.field_2._8_8_;
      _Var4._M_p = local_120._M_dataplus._M_p;
    }
    paVar9 = &local_f0;
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)_Var6._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p == paVar1) {
      local_f0._8_8_ = local_60.second.field_2._8_8_;
      _Var6._M_p = (pointer)paVar9;
      paVar2 = local_100;
    }
    local_100 = paVar2;
    local_f0._M_allocated_capacity = local_60.second.field_2._M_allocated_capacity;
    if (_Var4._M_p == local_120._M_dataplus._M_p) {
      _Var4._M_p = (pointer)&local_d0;
      local_d0._8_8_ = local_120.field_2._8_8_;
    }
    local_d0._M_allocated_capacity = local_60.first.field_2._M_allocated_capacity;
    local_120._M_string_length = 0;
    local_120.field_2._M_allocated_capacity =
         (ulong)(uint7)local_90._M_allocated_capacity._1_7_ << 8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p == paVar9) {
      _Var6._M_p = (pointer)&local_b0;
      local_b0._8_8_ = local_f0._8_8_;
    }
    psVar10 = &local_f8;
    sVar7 = local_f8;
    local_a0 = &local_90;
    local_80 = &local_70;
  }
  local_b0._M_allocated_capacity = local_60.second.field_2._M_allocated_capacity;
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(psVar10 + -1))->
  _M_dataplus)._M_p = (pointer)paVar9;
  *psVar10 = 0;
  paVar9->_M_local_buf[0] = '\0';
  paVar2 = &(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar2;
  local_e0 = &local_d0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p == local_e0) {
    paVar2->_M_allocated_capacity = local_d0._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_d0._8_8_;
  }
  else {
    (__return_storage_ptr__->first)._M_dataplus._M_p = _Var4._M_p;
    (__return_storage_ptr__->first).field_2._M_allocated_capacity = local_d0._M_allocated_capacity;
  }
  (__return_storage_ptr__->first)._M_string_length = sVar5;
  local_c0 = &local_b0;
  local_d8 = 0;
  local_d0._M_allocated_capacity = local_d0._M_allocated_capacity & 0xffffffffffffff00;
  paVar2 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p == local_c0) {
    paVar2->_M_allocated_capacity = local_b0._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = local_b0._8_8_;
  }
  else {
    (__return_storage_ptr__->second)._M_dataplus._M_p = _Var6._M_p;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity = local_b0._M_allocated_capacity;
  }
  (__return_storage_ptr__->second)._M_string_length = sVar7;
  local_b8 = 0;
  local_b0._M_allocated_capacity = local_b0._M_allocated_capacity & 0xffffffffffffff00;
  if (lVar3 == -1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.second._M_dataplus._M_p != &local_60.second.field_2) {
      operator_delete(local_60.second._M_dataplus._M_p,
                      local_60.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
      operator_delete(local_60.first._M_dataplus._M_p,
                      local_60.first.field_2._M_allocated_capacity + 1);
    }
    uVar8 = local_120.field_2._M_allocated_capacity;
    _Var4._M_p = local_120._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p == &local_120.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,CONCAT71(local_70._M_allocated_capacity._1_7_,
                                        local_70._M_local_buf[0]) + 1);
    }
    if (local_a0 == &local_90) {
      return __return_storage_ptr__;
    }
    uVar8 = CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]);
    _Var4._M_p = (pointer)local_a0;
  }
  operator_delete(_Var4._M_p,uVar8 + 1);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<text, text>
split_option( text arg )
{
    text::size_type pos = arg.rfind( '=' );

    return pos == text::npos
                ? std::make_pair( arg, text() )
                : std::make_pair( arg.substr( 0, pos ), arg.substr( pos + 1 ) );
}